

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

bool __thiscall
flatbuffers::php::PhpGenerator::SaveType
          (PhpGenerator *this,Definition *def,string *classcode,bool needs_imports)

{
  long lVar1;
  char *name;
  undefined7 in_register_00000009;
  Namespace *ns;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string filename;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string code;
  bool needs_imports_local;
  string *classcode_local;
  Definition *def_local;
  PhpGenerator *this_local;
  
  ns = (Namespace *)CONCAT71(in_register_00000009,needs_imports);
  code.field_2._M_local_buf[0xf] = needs_imports;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_51);
    std::allocator<char>::~allocator(&local_51);
    BaseGenerator::FullNamespace_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),(BaseGenerator *)0x4113c3,
               (char *)def->defined_namespace,ns);
    BeginFile(this,(string *)((long)&filename.field_2 + 8),
              (bool)(code.field_2._M_local_buf[0xf] & 1),(string *)local_50);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_50,(string *)classcode);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_e8,&this->super_BaseGenerator,def->defined_namespace,false);
    std::operator+(&local_c8,&local_e8,&def->name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &local_c8,".php");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    name = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = SaveFile(name,(string *)local_50,false);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool SaveType(const Definition &def, const std::string &classcode,
                bool needs_imports) {
    if (!classcode.length()) return true;

    std::string code = "";
    BeginFile(FullNamespace("\\", *def.defined_namespace), needs_imports,
              &code);
    code += classcode;

    std::string filename =
        NamespaceDir(*def.defined_namespace) + def.name + ".php";
    return SaveFile(filename.c_str(), code, false);
  }